

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void corruptSchema(InitData *pData,char *zObj,char *zExtra)

{
  int iVar1;
  char *pcVar2;
  sqlite3 *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  char *z;
  sqlite3 *db;
  char *local_28;
  sqlite3 *db_00;
  char *local_10;
  
  db_00 = (sqlite3 *)*in_RDI;
  if (db_00->mallocFailed == '\0') {
    if (*(long *)in_RDI[1] == 0) {
      if ((*(uint *)(in_RDI + 3) & 1) == 0) {
        if ((db_00->flags & 1) == 0) {
          local_10 = in_RSI;
          if (in_RSI == (char *)0x0) {
            local_10 = "?";
          }
          local_28 = sqlite3MPrintf(db_00,"malformed database schema (%s)",local_10);
          if ((in_RDX != (sqlite3 *)0x0) && (*(char *)&in_RDX->pVfs != '\0')) {
            local_28 = sqlite3MPrintf(db_00,"%z - %s",local_28,in_RDX);
          }
          *(char **)in_RDI[1] = local_28;
          iVar1 = sqlite3CorruptError(0);
          *(int *)((long)in_RDI + 0x14) = iVar1;
        }
        else {
          iVar1 = sqlite3CorruptError(0);
          *(int *)((long)in_RDI + 0x14) = iVar1;
        }
      }
      else {
        pcVar2 = sqlite3DbStrDup(in_RDX,(char *)db_00);
        *(char **)in_RDI[1] = pcVar2;
        *(undefined4 *)((long)in_RDI + 0x14) = 1;
      }
    }
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x14) = 7;
  }
  return;
}

Assistant:

static void corruptSchema(
  InitData *pData,     /* Initialization context */
  const char *zObj,    /* Object being parsed at the point of error */
  const char *zExtra   /* Error information */
){
  sqlite3 *db = pData->db;
  if( db->mallocFailed ){
    pData->rc = SQLITE_NOMEM_BKPT;
  }else if( pData->pzErrMsg[0]!=0 ){
    /* A error message has already been generated.  Do not overwrite it */
  }else if( pData->mInitFlags & INITFLAG_AlterTable ){
    *pData->pzErrMsg = sqlite3DbStrDup(db, zExtra);
    pData->rc = SQLITE_ERROR;
  }else if( db->flags & SQLITE_WriteSchema ){
    pData->rc = SQLITE_CORRUPT_BKPT;
  }else{
    char *z;
    if( zObj==0 ) zObj = "?";
    z = sqlite3MPrintf(db, "malformed database schema (%s)", zObj);
    if( zExtra && zExtra[0] ) z = sqlite3MPrintf(db, "%z - %s", z, zExtra);
    *pData->pzErrMsg = z;
    pData->rc = SQLITE_CORRUPT_BKPT;
  }
}